

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void sse::Flip(Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,uint32_t height,
              uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *inYEnd,bool horizontal,
              bool vertical,uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  uchar uVar2;
  ulong __n;
  undefined1 auVar3 [16];
  uchar *puVar4;
  long lVar5;
  uchar *puVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [16];
  uint8_t *outY;
  uchar *puVar9;
  
  auVar3 = _DAT_0017f250;
  if (horizontal && !vertical) {
    puVar9 = out->_data + ((ulong)width - 0x10) + (ulong)(startYOut * rowSizeOut) + (ulong)startXOut
    ;
    puVar4 = out->_data +
             (ulong)(startYOut * rowSizeOut) +
             ~(ulong)totalSimdWidth + (ulong)width + (ulong)startXOut;
    for (; inY != inYEnd; inY = *(undefined1 (*) [16])inY + rowSizeIn) {
      pauVar8 = (undefined1 (*) [16])inY;
      for (lVar5 = 0; -lVar5 != (ulong)simdWidth * 0x10; lVar5 = lVar5 + -0x10) {
        auVar1 = *pauVar8;
        pauVar8 = pauVar8 + 1;
        auVar1 = vpshufb_avx(auVar1,auVar3);
        *(undefined1 (*) [16])(puVar9 + lVar5) = auVar1;
      }
      if (nonSimdWidth != 0) {
        puVar6 = *(undefined1 (*) [16])inY + totalSimdWidth;
        for (lVar5 = 0; -lVar5 != (ulong)nonSimdWidth; lVar5 = lVar5 + -1) {
          uVar2 = *puVar6;
          puVar6 = puVar6 + 1;
          puVar4[lVar5] = uVar2;
        }
      }
      puVar9 = puVar9 + rowSizeOut;
      puVar4 = puVar4 + rowSizeOut;
    }
  }
  else {
    __n = (ulong)width;
    uVar7 = (ulong)(((startYOut - 1) + height) * rowSizeOut);
    puVar9 = out->_data + uVar7 + startXOut;
    if (vertical && !horizontal) {
      for (; inY != inYEnd; inY = inY + rowSizeIn) {
        memcpy(puVar9,inY,__n);
        puVar9 = puVar9 + -(ulong)rowSizeOut;
      }
    }
    else {
      puVar9 = puVar9 + (__n - 0x10);
      puVar4 = out->_data + uVar7 + ~(ulong)totalSimdWidth + startXOut + __n;
      for (; inY != inYEnd; inY = *(undefined1 (*) [16])inY + rowSizeIn) {
        pauVar8 = (undefined1 (*) [16])inY;
        for (lVar5 = 0; -lVar5 != (ulong)simdWidth * 0x10; lVar5 = lVar5 + -0x10) {
          auVar1 = *pauVar8;
          pauVar8 = pauVar8 + 1;
          auVar1 = vpshufb_avx(auVar1,auVar3);
          *(undefined1 (*) [16])(puVar9 + lVar5) = auVar1;
        }
        if (nonSimdWidth != 0) {
          puVar6 = *(undefined1 (*) [16])inY + totalSimdWidth;
          for (lVar5 = 0; -lVar5 != (ulong)nonSimdWidth; lVar5 = lVar5 + -1) {
            uVar2 = *puVar6;
            puVar6 = puVar6 + 1;
            puVar4[lVar5] = uVar2;
          }
        }
        puVar9 = puVar9 + -(ulong)rowSizeOut;
        puVar4 = puVar4 + -(ulong)rowSizeOut;
      }
    }
  }
  return;
}

Assistant:

void Flip( Image_Function::Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, const uint32_t rowSizeIn, 
               const uint32_t rowSizeOut, const uint8_t * inY, const uint8_t * inYEnd, bool horizontal, bool vertical, const uint32_t simdWidth, 
               const uint32_t totalSimdWidth, const uint32_t nonSimdWidth )
    {
        const simd ctrl = _mm_setr_epi8( 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0 );

        if( horizontal && !vertical ) {
            uint8_t * outYSimd = out.data() + startYOut * rowSizeOut + startXOut + width - simdSize;
            uint8_t * outY = out.data() + startYOut * rowSizeOut + startXOut + width - 1;

            for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut, outYSimd += rowSizeOut ) {
                const simd * inXSimd    = reinterpret_cast<const simd*>(inY);
                simd       * outXSimd   = reinterpret_cast<simd*>(outYSimd);
                const simd * inXEndSimd = inXSimd + simdWidth;

                for( ; inXSimd != inXEndSimd; ++inXSimd, --outXSimd )
                    _mm_storeu_si128( outXSimd, _mm_shuffle_epi8( _mm_loadu_si128( inXSimd ), ctrl ) );
                        
                if(nonSimdWidth > 0)
                {
                    const uint8_t * inX    = inY + totalSimdWidth;
                    uint8_t       * outX   = outY - totalSimdWidth;
                    const uint8_t * inXEnd = inX + nonSimdWidth;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
        }
        else if( !horizontal && vertical ) {
            uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut;

            for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut )
                memcpy( outY, inY, sizeof( uint8_t ) * width );
        }
        else {
            uint8_t * outYSimd = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut + width - simdSize;
            uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut + width - 1;

            for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut, outYSimd -= rowSizeOut ) {
                const simd * inXSimd    = reinterpret_cast<const simd*>(inY);
                simd       * outXSimd   = reinterpret_cast<simd*>(outYSimd);
                const simd * inXEndSimd = inXSimd + simdWidth;

                for( ; inXSimd != inXEndSimd; ++inXSimd, --outXSimd )
                    _mm_storeu_si128( outXSimd, _mm_shuffle_epi8( _mm_loadu_si128( inXSimd ), ctrl ) );
                        
                if(nonSimdWidth > 0)
                {
                    const uint8_t * inX    = inY + totalSimdWidth;
                    uint8_t       * outX   = outY - totalSimdWidth;
                    const uint8_t * inXEnd = inX + nonSimdWidth;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
        }
    }